

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::Directory::SetCurrentSource(Directory *this,string *dir)

{
  string *p;
  PointerType pBVar1;
  char *pcVar2;
  allocator local_99;
  string local_98;
  allocator local_61;
  string local_60;
  string local_40;
  string *local_20;
  string *loc;
  string *dir_local;
  Directory *this_local;
  
  loc = dir;
  dir_local = (string *)this;
  pBVar1 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  local_20 = &pBVar1->Location;
  std::__cxx11::string::operator=((string *)local_20,(string *)loc);
  cmsys::SystemTools::ConvertToUnixSlashes(local_20);
  cmsys::SystemTools::CollapseFullPath(&local_40,local_20);
  std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  p = local_20;
  pBVar1 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  cmsys::SystemTools::SplitPath(p,&pBVar1->CurrentSourceDirectoryComponents,true);
  ComputeRelativePathTopSource(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CMAKE_CURRENT_SOURCE_DIR",&local_61);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,pcVar2,&local_99);
  Snapshot::SetDefinition(&this->Snapshot_,&local_60,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void cmState::Directory::SetCurrentSource(std::string const& dir)
{
  std::string& loc = this->DirectoryState->Location;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  cmSystemTools::SplitPath(
      loc,
      this->DirectoryState->CurrentSourceDirectoryComponents);
  this->ComputeRelativePathTopSource();

  this->Snapshot_.SetDefinition("CMAKE_CURRENT_SOURCE_DIR", loc.c_str());
}